

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_varbuff_to_bytes
              (uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  long lVar2;
  leint16_t tmp;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (bytes_out != (uchar *)0x0 && (bytes_len == 0) != (bytes != (uchar *)0x0)) {
    lVar2 = 1;
    if ((0xfc < bytes_len) && (lVar2 = 3, 0xffff < bytes_len)) {
      lVar2 = (ulong)(bytes_len >> 0x20 != 0) * 4 + 5;
    }
    if ((written != (size_t *)0x0) && (lVar2 + bytes_len <= len)) {
      if (bytes_len < 0xfd) {
        *bytes_out = (uchar)bytes_len;
        lVar2 = 1;
      }
      else if (bytes_len < 0x10000) {
        *bytes_out = 0xfd;
        *(short *)(bytes_out + 1) = (short)bytes_len;
        lVar2 = 3;
      }
      else if (bytes_len >> 0x20 == 0) {
        *bytes_out = 0xfe;
        *(int *)(bytes_out + 1) = (int)bytes_len;
        lVar2 = 5;
      }
      else {
        *bytes_out = 0xff;
        *(size_t *)(bytes_out + 1) = bytes_len;
        lVar2 = 9;
      }
      if (bytes_len != 0) {
        memcpy(bytes_out + lVar2,bytes,bytes_len);
      }
      *written = lVar2 + bytes_len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                           unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !bytes_out ||
        len < varint_get_length(bytes_len) + bytes_len || !written)
        return WALLY_EINVAL;
    *written = varbuff_to_bytes(bytes, bytes_len, bytes_out);
    return WALLY_OK;
}